

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_iterator_suite.cpp
# Opt level: O3

void iterator_suite::test_empty(void)

{
  bool v;
  array<int,_4UL> array;
  circular_view<int,_18446744073709551615UL> span;
  type local_58 [6];
  iterator_type local_40;
  basic_iterator<int> local_30;
  circular_view<int,_18446744073709551615UL> local_20;
  
  local_20.member.data = local_58;
  local_58[0] = 0;
  local_58[1] = 0;
  local_58[2] = 0;
  local_58[3] = 0;
  local_40.parent = &local_20;
  local_20.member.cap = 4;
  local_20.member.size = 0;
  local_20.member.next = 4;
  local_30.current = 4;
  local_40.current = 4;
  local_30.parent = local_40.parent;
  v = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator==
                (&local_30,&local_40);
  boost::detail::test_impl
            ("span.begin() == span.end()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x26b,"void iterator_suite::test_empty()",v);
  return;
}

Assistant:

void test_empty()
{
    std::array<int, 4> array = {};
    circular_view<int> span(array.begin(), array.end());
    BOOST_TEST(span.begin() == span.end());
}